

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O1

char16_t *
fmt::v8::detail::
parse_precision<char16_t,fmt::v8::detail::specs_checker<fmt::v8::detail::specs_handler<char16_t>>&>
          (char16_t *begin,char16_t *end,
          specs_checker<fmt::v8::detail::specs_handler<char16_t>_> *handler)

{
  char16_t cVar1;
  uint uVar2;
  int iVar3;
  char16_t *pcVar4;
  char16_t *local_58;
  precision_adapter local_50;
  undefined1 local_48 [40];
  
  local_58 = begin + 1;
  if (local_58 == end) {
    uVar2 = 0;
  }
  else {
    uVar2 = (uint)(ushort)*local_58;
  }
  if (uVar2 - 0x30 < 10) {
    iVar3 = parse_nonnegative_int<char16_t>(&local_58,end,-1);
    if (iVar3 == -1) {
      fmt::v8::detail::throw_format_error("number is too big");
    }
    ((handler->super_specs_handler<char16_t>).super_specs_setter<char16_t>.specs_)->precision =
         iVar3;
  }
  else {
    if (uVar2 != 0x7b) {
      fmt::v8::detail::throw_format_error("missing precision specifier");
    }
    pcVar4 = begin + 2;
    local_58 = pcVar4;
    if (pcVar4 != end) {
      local_50.handler = handler;
      if ((*pcVar4 == L':') || (*pcVar4 == L'}')) {
        specs_handler<char16_t>::get_arg(local_48,&handler->super_specs_handler<char16_t>);
        iVar3 = get_dynamic_spec<fmt::v8::detail::precision_checker,fmt::v8::basic_format_arg<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,char16_t>>,fmt::v8::detail::error_handler>
                          ();
        ((handler->super_specs_handler<char16_t>).super_specs_setter<char16_t>.specs_)->precision =
             iVar3;
        local_58 = pcVar4;
      }
      else {
        local_58 = do_parse_arg_id<char16_t,fmt::v8::detail::parse_precision<char16_t,fmt::v8::detail::specs_checker<fmt::v8::detail::specs_handler<char16_t>>&>(char16_t_const*,char16_t_const*,fmt::v8::detail::specs_checker<fmt::v8::detail::specs_handler<char16_t>>&)::precision_adapter&>
                             (pcVar4,end,&local_50);
      }
    }
    if ((local_58 == end) ||
       (pcVar4 = local_58 + 1, cVar1 = *local_58, local_58 = pcVar4, cVar1 != L'}')) {
      fmt::v8::detail::throw_format_error("invalid format string");
    }
  }
  if ((handler->arg_type_ < custom_type) && ((0x41feU >> (handler->arg_type_ & 0x1f) & 1) != 0)) {
    fmt::v8::detail::throw_format_error("precision not allowed for this argument type");
  }
  return local_58;
}

Assistant:

FMT_CONSTEXPR auto parse_precision(const Char* begin, const Char* end,
                                   Handler&& handler) -> const Char* {
  using detail::auto_id;
  struct precision_adapter {
    Handler& handler;

    FMT_CONSTEXPR void operator()() { handler.on_dynamic_precision(auto_id()); }
    FMT_CONSTEXPR void operator()(int id) { handler.on_dynamic_precision(id); }
    FMT_CONSTEXPR void operator()(basic_string_view<Char> id) {
      handler.on_dynamic_precision(id);
    }
    FMT_CONSTEXPR void on_error(const char* message) {
      if (message) handler.on_error(message);
    }
  };

  ++begin;
  auto c = begin != end ? *begin : Char();
  if ('0' <= c && c <= '9') {
    auto precision = parse_nonnegative_int(begin, end, -1);
    if (precision != -1)
      handler.on_precision(precision);
    else
      handler.on_error("number is too big");
  } else if (c == '{') {
    ++begin;
    if (begin != end)
      begin = parse_arg_id(begin, end, precision_adapter{handler});
    if (begin == end || *begin++ != '}')
      return handler.on_error("invalid format string"), begin;
  } else {
    return handler.on_error("missing precision specifier"), begin;
  }
  handler.end_precision();
  return begin;
}